

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O1

int do_gfsp_generic_cmd(int argc,char **argv)

{
  size_t __n;
  size_t sVar1;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  char **ppcVar5;
  int *piVar6;
  FILE *__s;
  size_t sVar7;
  char *arg;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  long in_FS_OFFSET;
  size_t actual_received_size;
  size_t in_buf_size;
  igsc_device_handle handle;
  uint8_t out_buf [2048];
  uint8_t in_buf [2048];
  igsc_device_info dev_info;
  igsc_device_info *local_11b0;
  igsc_device_info *local_11a8;
  size_t local_11a0;
  size_t local_1198 [2];
  undefined1 local_1188 [2048];
  uint8_t local_988 [2050];
  igsc_device_info local_186;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined7 uStack_50;
  undefined1 uStack_49;
  undefined7 local_48;
  undefined1 uStack_41;
  undefined7 uStack_40;
  undefined1 uStack_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  local_1198[0] = 0;
  local_11a0 = 0;
  if (argc < 1) {
    iVar3 = -1;
    if (quiet == '\0') {
      do_gfsp_generic_cmd_cold_9();
    }
    goto LAB_0010c644;
  }
  local_1198[1] = 0;
  local_11a8 = (igsc_device_info *)0x0;
  uVar9 = 0;
  pcVar10 = (char *)0x0;
  local_11b0 = (igsc_device_info *)0x0;
  do {
    arg = *argv;
    _Var2 = arg_is_device(arg);
    if (_Var2) {
      if ((uint)argc < 2) {
        iVar3 = -1;
        if (quiet == '\0') {
          do_gfsp_generic_cmd_cold_6();
        }
        goto LAB_0010c644;
      }
      iVar8 = argc - 1;
      if (argc == 0) {
        iVar8 = iVar3;
      }
      local_11a8 = (igsc_device_info *)argv[1];
    }
    else {
      _Var2 = arg_is_token(arg,"--cmd");
      if (_Var2) {
        if (pcVar10 != (char *)0x0) {
          iVar3 = -1;
          if (quiet == '\0') {
            do_gfsp_generic_cmd_cold_4();
          }
          goto LAB_0010c644;
        }
        if ((uint)argc < 2) {
          iVar3 = -1;
          if (quiet == '\0') {
            do_gfsp_generic_cmd_cold_5();
          }
          goto LAB_0010c644;
        }
        iVar8 = argc - 1;
        if (argc == 0) {
          iVar8 = iVar3;
        }
        arg = argv[1];
        uVar9 = atol(arg);
        if ((int)uVar9 == 0) {
          iVar3 = -1;
          if (quiet == '\0') {
            pcVar10 = "Error: Bad gfsp command value argument \'%s\'\n";
            goto LAB_0010c284;
          }
          goto LAB_0010c644;
        }
        pcVar10 = (char *)0x0;
      }
      else {
        _Var2 = arg_is_token(arg,"--in");
        if (_Var2) {
          if ((uint)argc < 2) {
            iVar3 = -1;
            if (quiet == '\0') {
              do_gfsp_generic_cmd_cold_3();
            }
            goto LAB_0010c644;
          }
          iVar8 = argc - 1;
          if (argc == 0) {
            iVar8 = iVar3;
          }
          pcVar10 = argv[1];
        }
        else {
          _Var2 = arg_is_token(arg,"--out");
          if (!_Var2) {
            iVar3 = -1;
            if (quiet == '\0') {
              pcVar10 = "Error: Wrong argument %s\n";
LAB_0010c284:
              iVar3 = -1;
              fprintf(_stderr,pcVar10,arg);
            }
            goto LAB_0010c644;
          }
          if (local_11b0 != (igsc_device_info *)0x0) {
            iVar3 = -1;
            if (quiet == '\0') {
              do_gfsp_generic_cmd_cold_1();
            }
            goto LAB_0010c644;
          }
          if ((uint)argc < 2) {
            iVar3 = -1;
            if (quiet == '\0') {
              do_gfsp_generic_cmd_cold_2();
            }
            goto LAB_0010c644;
          }
          iVar8 = argc - 1;
          if (argc == 0) {
            iVar8 = iVar3;
          }
          local_11b0 = (igsc_device_info *)argv[1];
        }
      }
    }
    ppcVar5 = argv + 1;
    argv = argv + 2;
    if (iVar8 == 0) {
      argv = ppcVar5;
    }
    argc = iVar8 - 1U;
    if (iVar8 == 0) {
      argc = 0;
    }
  } while (iVar8 != 0 && iVar8 - 1U != 0);
  if ((((int)uVar9 == 0) || (pcVar10 == (char *)0x0)) || (local_11b0 == (igsc_device_info *)0x0)) {
    iVar3 = -1;
    if (quiet == '\0') {
      do_gfsp_generic_cmd_cold_7();
    }
    goto LAB_0010c644;
  }
  if (local_11a8 == (igsc_device_info *)0x0) {
    iVar3 = get_first_device_info(&local_186);
    if (iVar3 == 0) {
      iVar3 = igsc_device_init_by_device_info(local_1198 + 1,&local_186);
      if (iVar3 == 0) goto LAB_0010c32d;
      iVar3 = 1;
      if (quiet == '\0') {
        pcVar10 = "Error: Cannot initialize device: %s\n";
        local_11a8 = &local_186;
        iVar3 = 1;
        goto LAB_0010c633;
      }
    }
    else {
      iVar3 = 1;
      if (quiet == '\0') {
        do_gfsp_generic_cmd_cold_8();
      }
    }
  }
  else {
    iVar3 = igsc_device_init_by_device(local_1198 + 1,local_11a8);
    if (iVar3 == 0) {
LAB_0010c32d:
      iVar3 = read_from_file_to_buf(pcVar10,local_988,0x800,local_1198);
      if (iVar3 != 0) {
        printf("Failed to read file : %s, using empty in buffer\n",pcVar10);
        local_1198[0] = 0;
      }
      sVar1 = local_1198[0];
      printf("Sending %zu bytes of input data by gfsp generic api\n",local_1198[0]);
      if (sVar1 == 0) {
        iVar3 = 3;
        do {
          uVar4 = igsc_gfsp_heci_cmd(local_1198 + 1,uVar9 & 0xffffffff,0,0,local_1188,0x800,
                                     &local_11a0);
          if (uVar4 != 0xd) goto LAB_0010c41a;
          usleep(2000000);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      else {
        iVar3 = 3;
        do {
          uVar4 = igsc_gfsp_heci_cmd(local_1198 + 1,uVar9 & 0xffffffff,local_988,sVar1,local_1188,
                                     0x800,&local_11a0);
          if (uVar4 != 0xd) goto LAB_0010c41a;
          usleep(2000000);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      uVar9 = 0xd;
      goto LAB_0010c41c;
    }
    iVar3 = 1;
    if (quiet == '\0') {
      pcVar10 = "Error: Cannot initialize device: %s\n";
      iVar3 = 1;
      goto LAB_0010c633;
    }
  }
  goto LAB_0010c63a;
LAB_0010c41a:
  uVar9 = (ulong)uVar4;
LAB_0010c41c:
  printf("Received %zu bytes of data\n",local_11a0);
  iVar3 = (int)uVar9;
  local_11a8 = local_11b0;
  if (iVar3 == 0) {
LAB_0010c44d:
    __n = local_11a0;
    local_48 = 0;
    uStack_41 = 0;
    uStack_40 = 0;
    uStack_39 = 0;
    local_58 = 0;
    uStack_50 = 0;
    uStack_49 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    piVar6 = __errno_location();
    *piVar6 = 0;
    __s = fopen(local_11b0->name,"wb");
    if (__s == (FILE *)0x0 || *piVar6 != 0) {
      iVar3 = __xpg_strerror_r(*piVar6,&local_78,0x40);
      if (iVar3 != 0) {
        local_48 = 0;
        uStack_41 = 0;
        uStack_40 = 0;
        local_58 = 0;
        uStack_50 = 0;
        uStack_49 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0x206e776f6e6b6e55;
        uStack_70 = 0x726f727265;
        uStack_39 = 0;
      }
      if ((verbose == '\x01') && (quiet == '\0')) {
        pcVar10 = "Failed to open file %s : %s\n";
LAB_0010c696:
        fprintf(_stderr,pcVar10,local_11b0,&local_78);
      }
    }
    else {
      sVar7 = fwrite(local_1188,1,__n,__s);
      if (sVar7 == __n) {
        fclose(__s);
        printf("Wrote %zu bytes to %s\n",local_11a0,local_11b0);
        goto LAB_0010c63a;
      }
      iVar3 = __xpg_strerror_r(*piVar6,&local_78,0x40);
      if (iVar3 != 0) {
        local_48 = 0;
        uStack_41 = 0;
        uStack_40 = 0;
        local_58 = 0;
        uStack_50 = 0;
        uStack_49 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0x206e776f6e6b6e55;
        uStack_70 = 0x726f727265;
        uStack_39 = 0;
      }
      if ((verbose == '\x01') && (quiet == '\0')) {
        pcVar10 = "Failed to read file %s : %s\n";
        goto LAB_0010c696;
      }
    }
    if (__s != (FILE *)0x0) {
      fclose(__s);
    }
    iVar3 = 1;
    if (quiet != '\0') goto LAB_0010c63a;
    pcVar10 = "Error: Failed to write file : %s\n";
    iVar3 = 1;
  }
  else {
    if (quiet == '\0') {
      fprintf(_stderr,"Error: gfsp command failed, return code %d, bytes received %zu\n",uVar9,
              local_11a0);
    }
    if ((iVar3 == 7) || (iVar3 == 0)) goto LAB_0010c44d;
    if (quiet != '\0') goto LAB_0010c63a;
    pcVar10 = "Error: Wrote nothing to %s\n";
  }
LAB_0010c633:
  fprintf(_stderr,pcVar10,local_11a8);
LAB_0010c63a:
  igsc_device_close(local_1198 + 1);
LAB_0010c644:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

mockable_static
int do_gfsp_generic_cmd(int argc, char *argv[])
{
    struct igsc_device_handle handle;
    const char *device_path = NULL;
    struct igsc_device_info dev_info;
    uint32_t cmd = 0;
    char *infile = NULL, *outfile = NULL;
    uint8_t in_buf[MAX_BUF_SIZE], out_buf[MAX_BUF_SIZE];
    size_t in_buf_size = 0;
    int ret;
    size_t actual_received_size = 0;
    unsigned int retries = 0;

    if (argc <= 0)
    {
        fwupd_error("Missing arguments\n");
        return ERROR_BAD_ARGUMENT;
    }

    memset(&handle, 0, sizeof(handle));

    do
    {
        if (arg_is_device(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No device was provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            device_path = argv[0];
        }
        else if (arg_is_cmd(argv[0]))
        {
            if (infile)
            {
                fwupd_error("The in-file argument appears twice\n");
                return ERROR_BAD_ARGUMENT;
            }
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No fgsp command value provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            cmd = (uint32_t)atol(argv[0]);
            if (!cmd)
            {
                fwupd_error("Bad gfsp command value argument '%s'\n", argv[0]);
                return ERROR_BAD_ARGUMENT;
            }
        }
        else if (arg_is_in(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No in-file name provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            infile = argv[0];
        }
        else if (arg_is_out(argv[0]))
        {
            if (outfile)
            {
                fwupd_error("The out-file argument appears twice\n");
                return ERROR_BAD_ARGUMENT;
            }
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No out-file name provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            outfile = argv[0];
        }
        else
        {
            fwupd_error("Wrong argument %s\n", argv[0]);
            return ERROR_BAD_ARGUMENT;
        }
    } while(arg_next(&argc, &argv));

    if (cmd == 0 || !infile || !outfile)
    {
        fwupd_error("Not enough arguments\n");
        return ERROR_BAD_ARGUMENT;
    }

    if (device_path)
    {
        ret = igsc_device_init_by_device(&handle, device_path);
        if (ret)
        {
           ret = EXIT_FAILURE;
           fwupd_error("Cannot initialize device: %s\n", device_path);
           goto out;
        }
    }
    else
    {
        if (get_first_device_info(&dev_info))
        {
            ret = EXIT_FAILURE;
            fwupd_error("No device to work with\n");
            goto out;
        }

        ret = igsc_device_init_by_device_info(&handle, &dev_info);
        if (ret)
        {
            ret = EXIT_FAILURE;
            fwupd_error("Cannot initialize device: %s\n", dev_info.name);
            goto out;
        }
    }

    if (read_from_file_to_buf(infile, in_buf, sizeof(in_buf), &in_buf_size) != 0)
    {
        printf("Failed to read file : %s, using empty in buffer\n", infile);
        in_buf_size = 0;
    }
    printf("Sending %zu bytes of input data by gfsp generic api\n", in_buf_size);
    if (in_buf_size)
    {
        while ((ret = igsc_gfsp_heci_cmd(&handle, cmd, in_buf, in_buf_size,
                                         out_buf, sizeof(out_buf),
                                         &actual_received_size)) == IGSC_ERROR_BUSY)
        {
            gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
            if (++retries >= MAX_CONNECT_RETRIES)
                break;
        }
    }
    else
    {
        while ((ret = igsc_gfsp_heci_cmd(&handle, cmd, NULL, 0,
                                         out_buf, sizeof(out_buf),
                                         &actual_received_size)) == IGSC_ERROR_BUSY)
        {
            gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
            if (++retries >= MAX_CONNECT_RETRIES)
                break;
        }
    }
    printf("Received %zu bytes of data\n", actual_received_size);
    if (ret)
    {
        fwupd_error("gfsp command failed, return code %d, bytes received %zu\n",
                     ret, actual_received_size);
    }
    if (ret == 0 || ret == IGSC_ERROR_BUFFER_TOO_SMALL)
    {
        /* copy data to the out_buf */
        if (write_to_file_from_buf(outfile, out_buf, actual_received_size) != 0)
        {
            ret = EXIT_FAILURE;
            fwupd_error("Failed to write file : %s\n", outfile);
            goto out;
        }
        printf("Wrote %zu bytes to %s\n", actual_received_size, outfile);
    }
    else
    {
        fwupd_error("Wrote nothing to %s\n", outfile);
    }

out:
    igsc_device_close(&handle);
    return ret;
}